

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::iterate(SparseTextureClampLookupColorTestCase *this)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  pointer pFVar5;
  long lVar6;
  ostream *poVar7;
  undefined8 uVar8;
  ulong uVar9;
  int *piVar10;
  int iVar12;
  int *piVar13;
  undefined8 extraout_RDX;
  char *description;
  int iVar14;
  qpTestResult testResult;
  TestContext *this_00;
  int iVar15;
  int *piVar16;
  GLuint texture;
  FunctionToken funcToken;
  GLuint local_274;
  int *local_270;
  uint local_264;
  Functions *local_260;
  string *local_258;
  long *local_250 [2];
  long local_240 [2];
  long *local_230 [2];
  long local_220 [2];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_210;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  ostream *local_1c0;
  pointer local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  undefined7 uVar11;
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_SparseTextureClampLookupResidencyTestCase).
                      super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                      super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->m_contextInfo
                     ,"GL_ARB_sparse_texture_clamp");
  if (bVar2) {
    iVar4 = (*((this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    local_260 = (Functions *)CONCAT44(extraout_var,iVar4);
    local_270 = (this->super_SparseTextureClampLookupResidencyTestCase).
                super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                super_SparseTextureCommitmentTestCase.mSupportedTargets.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
    piVar10 = (this->super_SparseTextureClampLookupResidencyTestCase).
              super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.mSupportedTargets.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
    if (local_270 != piVar10) {
      local_258 = (string *)
                  &(this->super_SparseTextureClampLookupResidencyTestCase).
                   super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                   super_SparseTextureCommitmentTestCase.field_0x90;
      local_1c0 = (ostream *)
                  &(this->super_SparseTextureClampLookupResidencyTestCase).
                   super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                   super_SparseTextureCommitmentTestCase.field_0x88;
      piVar13 = (this->super_SparseTextureClampLookupResidencyTestCase).
                super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish;
      local_264 = (uint)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      do {
        piVar16 = (this->super_SparseTextureClampLookupResidencyTestCase).
                  super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                  super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        if (piVar16 != piVar13) {
          do {
            cVar3 = (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                           super_SparseTexture2LookupTestCase.
                                           super_SparseTexture2CommitmentTestCase.
                                           super_SparseTextureCommitmentTestCase.super_TestCase.
                                           super_TestCase.super_TestNode + 0x30))
                              (this,*local_270,*piVar16);
            if ((cVar3 != '\0') &&
               (pFVar5 = (this->super_SparseTextureClampLookupResidencyTestCase).
                         super_SparseTexture2LookupTestCase.mFunctions.
                         super__Vector_base<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               pFVar5 != (this->super_SparseTextureClampLookupResidencyTestCase).
                         super_SparseTexture2LookupTestCase.mFunctions.
                         super__Vector_base<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
                         ._M_impl.super__Vector_impl_data._M_finish)) {
              do {
                local_250[0] = local_240;
                pcVar1 = (pFVar5->name)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_250,pcVar1,pcVar1 + (pFVar5->name)._M_string_length);
                pcVar1 = (pFVar5->arguments)._M_dataplus._M_p;
                local_230[0] = local_220;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_230,pcVar1,pcVar1 + (pFVar5->arguments)._M_string_length)
                ;
                local_1b8 = pFVar5;
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                _Rb_tree(&local_210,&(pFVar5->allowedTargets)._M_t);
                cVar3 = (**(code **)(*(long *)&(this->
                                               super_SparseTextureClampLookupResidencyTestCase).
                                               super_SparseTexture2LookupTestCase.
                                               super_SparseTexture2CommitmentTestCase.
                                               super_SparseTextureCommitmentTestCase.super_TestCase.
                                               super_TestCase.super_TestNode + 0x88))
                                  (this,*local_270,*piVar16,(string *)local_250);
                iVar4 = 10;
                if (cVar3 != '\0') {
                  lVar6 = std::__cxx11::string::find((char *)local_250,0x1aae05e,0);
                  local_1b0 = (undefined1  [8])local_1a0;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1aee929);
                  std::__cxx11::stringbuf::str(local_258);
                  if (local_1b0 != (undefined1  [8])local_1a0) {
                    operator_delete((void *)local_1b0,
                                    (ulong)((long)&(local_1a0[0].m_log)->flags + 1));
                  }
                  poVar7 = local_1c0;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1c0,"Testing sparse texture lookup color functions for target: ",
                             0x3a);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*local_270);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", format: ",10);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*piVar16);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
                  (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                         super_SparseTexture2LookupTestCase.
                                         super_SparseTexture2CommitmentTestCase.
                                         super_SparseTextureCommitmentTestCase.super_TestCase.
                                         super_TestCase.super_TestNode + 0x40 +
                              (ulong)(lVar6 == -1) * 8))
                            (this,local_260,*local_270,*piVar16,&local_274,3);
                  if (*piVar16 == 0x81a5) {
                    (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                           super_SparseTexture2LookupTestCase.
                                           super_SparseTexture2CommitmentTestCase.
                                           super_SparseTextureCommitmentTestCase.super_TestCase.
                                           super_TestCase.super_TestNode + 0x90))
                              (this,local_260,*local_270,&local_274);
                  }
                  iVar15 = 0;
                  iVar4 = 0;
                  if ((this->super_SparseTextureClampLookupResidencyTestCase).
                      super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                      super_SparseTextureCommitmentTestCase.mState.levels < 1) {
LAB_00a68888:
                    uVar9 = (ulong)local_264;
                    do {
                      if (((uVar9 & 1) == 0) ||
                         (uVar8 = (**(code **)(*(long *)&(this->
                                                  super_SparseTextureClampLookupResidencyTestCase).
                                                  super_SparseTexture2LookupTestCase.
                                                  super_SparseTexture2CommitmentTestCase.
                                                  super_SparseTextureCommitmentTestCase.
                                                  super_TestCase.super_TestCase.super_TestNode +
                                              0x98))(this,local_260,*local_270,*piVar16,&local_274,
                                                     iVar15,local_250), (char)uVar8 == '\0')) {
                        local_264 = 0;
                        goto LAB_00a688e4;
                      }
                      iVar15 = iVar15 + 1;
                      uVar11 = (undefined7)((ulong)uVar8 >> 8);
                      uVar9 = CONCAT71(uVar11,1);
                    } while (iVar15 <= iVar4);
                    local_264 = (uint)CONCAT71(uVar11,1);
                  }
                  else {
                    iVar4 = 0;
                    iVar14 = 0;
                    do {
                      iVar12 = *piVar16;
                      if (lVar6 == -1) {
LAB_00a68858:
                        (**(code **)(*(long *)&(this->
                                               super_SparseTextureClampLookupResidencyTestCase).
                                               super_SparseTexture2LookupTestCase.
                                               super_SparseTexture2CommitmentTestCase.
                                               super_SparseTextureCommitmentTestCase.super_TestCase.
                                               super_TestCase.super_TestNode + 0x50))
                                  (this,local_260,*local_270,iVar12,&local_274,iVar14);
                        iVar4 = iVar14;
                      }
                      else {
                        cVar3 = (**(code **)(*(long *)&(this->
                                                  super_SparseTextureClampLookupResidencyTestCase).
                                                  super_SparseTexture2LookupTestCase.
                                                  super_SparseTexture2CommitmentTestCase.
                                                  super_SparseTextureCommitmentTestCase.
                                                  super_TestCase.super_TestCase.super_TestNode +
                                            0x60))(this,local_260,*local_270,iVar12,&local_274,
                                                   iVar14);
                        if (cVar3 != '\0') {
                          iVar12 = *piVar16;
                          goto LAB_00a68858;
                        }
                      }
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < (this->super_SparseTextureClampLookupResidencyTestCase).
                                      super_SparseTexture2LookupTestCase.
                                      super_SparseTexture2CommitmentTestCase.
                                      super_SparseTextureCommitmentTestCase.mState.levels);
                    if (-1 < iVar4) goto LAB_00a68888;
                  }
LAB_00a688e4:
                  gl4cts::Texture::Delete(local_260,&local_274);
                  iVar4 = 0;
                  if ((local_264 & 1) == 0) {
                    local_1b0 = (undefined1  [8])
                                ((this->super_SparseTextureClampLookupResidencyTestCase).
                                 super_SparseTexture2LookupTestCase.
                                 super_SparseTexture2CommitmentTestCase.
                                 super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase
                                 .super_TestNode.m_testCtx)->m_log;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    std::__cxx11::stringbuf::str();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_1e0,local_1d8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"Fail",4);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    if (local_1e0 != local_1d0) {
                      operator_delete(local_1e0,local_1d0[0] + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    std::ios_base::~ios_base(local_138);
                    iVar4 = 1;
                    tcu::TestContext::setTestResult
                              ((this->super_SparseTextureClampLookupResidencyTestCase).
                               super_SparseTexture2LookupTestCase.
                               super_SparseTexture2CommitmentTestCase.
                               super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
                  }
                }
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                ~_Rb_tree(&local_210);
                if (local_230[0] != local_220) {
                  operator_delete(local_230[0],local_220[0] + 1);
                }
                if (local_250[0] != local_240) {
                  operator_delete(local_250[0],local_240[0] + 1);
                }
                if ((iVar4 != 10) && (iVar4 != 0)) {
                  return STOP;
                }
                pFVar5 = local_1b8 + 1;
              } while (pFVar5 != (this->super_SparseTextureClampLookupResidencyTestCase).
                                 super_SparseTexture2LookupTestCase.mFunctions.
                                 super__Vector_base<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
            }
            piVar13 = piVar16 + 1;
            piVar16 = piVar13;
          } while (piVar13 !=
                   (this->super_SparseTextureClampLookupResidencyTestCase).
                   super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                   super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish);
          piVar10 = (this->super_SparseTextureClampLookupResidencyTestCase).
                    super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                    super_SparseTextureCommitmentTestCase.mSupportedTargets.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish;
        }
        local_270 = local_270 + 1;
      } while (local_270 != piVar10);
    }
    this_00 = (this->super_SparseTextureClampLookupResidencyTestCase).
              super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_00 = (this->super_SparseTextureClampLookupResidencyTestCase).
              super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseTextureClampLookupColorTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture_clamp"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			if (!caseAllowed(target, format))
				continue;

			for (std::vector<FunctionToken>::const_iterator tokIter = mFunctions.begin(); tokIter != mFunctions.end();
				 ++tokIter)
			{
				// Check if target is allowed for current lookup function
				FunctionToken funcToken = *tokIter;
				if (!funcAllowed(target, format, funcToken))
					continue;

				bool isSparse = false;
				if (funcToken.name.find("sparse", 0) != std::string::npos)
					isSparse = true;

				mLog.str("");
				mLog << "Testing sparse texture lookup color functions for target: " << target << ", format: " << format
					 << " - ";

				if (isSparse)
					sparseAllocateTexture(gl, target, format, texture, 3);
				else
					allocateTexture(gl, target, format, texture, 3);

				if (format == GL_DEPTH_COMPONENT16)
					setupDepthMode(gl, target, texture);

				int l;
				int maxLevels = 0;
				for (l = 0; l < mState.levels; ++l)
				{
					if (!isSparse || commitTexturePage(gl, target, format, texture, l))
					{
						writeDataToTexture(gl, target, format, texture, l);
						maxLevels = l;
					}
				}

				for (l = 0; l <= maxLevels; ++l)
				{
					result = result && verifyLookupTextureData(gl, target, format, texture, l, funcToken);

					if (!result)
						break;
				}

				Texture::Delete(gl, texture);

				if (!result)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}